

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

TreeNode * anon_unknown.dwarf_1a9ae::add_exp(void)

{
  TreeNode *pTVar1;
  TreeNode *pTVar2;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  pTVar1 = newNode(Void,lineno);
  if (pTVar1 != (TreeNode *)0x0) {
    pTVar2 = mul_exp();
    pTVar1->child[0] = pTVar2;
  }
  if ((anonymous_namespace)::token == TK_SUB) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
    if ((anonymous_namespace)::token == TK_SUB) {
      (anonymous_namespace)::token = getToken();
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    pTVar1->nodetype = SUB_EXP;
  }
  else {
    if ((anonymous_namespace)::token != TK_PLUS) {
      return pTVar1->child[0];
    }
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"");
    if ((anonymous_namespace)::token == TK_PLUS) {
      (anonymous_namespace)::token = getToken();
    }
    if (local_30[0] != local_20) {
      operator_delete(local_30[0]);
    }
    pTVar1->nodetype = PLUS_EXP;
  }
  pTVar2 = add_exp();
  pTVar1->child[1] = pTVar2;
  return pTVar1;
}

Assistant:

TreeNode* add_exp(){
        TreeNode *t = newNode(Void, lineno);
        if(t != nullptr){
            t->child[0] = mul_exp();
        }
        switch(token){
            case TK_PLUS:
                match(TK_PLUS);
                t->nodetype = PLUS_EXP;
                t->child[1] = add_exp();
                break;
            case TK_SUB:
                match(TK_SUB);
                t->nodetype = SUB_EXP;
                t->child[1] = add_exp();
                break;
            default:
                t = t->child[0];
                break;
        }
        return t;
    }